

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_sendquote(Curl_easy *data,connectdata *conn,curl_slist *quote)

{
  ssize_t sVar1;
  curltime cVar2;
  undefined4 uStack_64;
  int local_5c;
  CURLcode local_58;
  int ftpcode;
  CURLcode result;
  _Bool acceptfail;
  char *cmd;
  ssize_t nread;
  pingpong *pp;
  ftp_conn *ftpc;
  curl_slist *item;
  curl_slist *quote_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  nread = (ssize_t)&conn->proto;
  pp = (pingpong *)nread;
  ftpc = (ftp_conn *)quote;
  item = quote;
  quote_local = (curl_slist *)conn;
  conn_local = (connectdata *)data;
  do {
    if (ftpc == (ftp_conn *)0x0) {
      return CURLE_OK;
    }
    if ((ftpc->pp).cache != (char *)0x0) {
      _result = (ftpc->pp).cache;
      local_5c = 0;
      ftpcode._3_1_ = *_result == '*';
      if ((bool)ftpcode._3_1_) {
        _result = _result + 1;
      }
      local_58 = Curl_pp_sendf((Curl_easy *)conn_local,pp,"%s",_result);
      sVar1 = nread;
      if (local_58 == CURLE_OK) {
        cVar2 = Curl_now();
        *(time_t *)(sVar1 + 0x40) = cVar2.tv_sec;
        *(ulong *)(sVar1 + 0x48) = CONCAT44(uStack_64,cVar2.tv_usec);
        local_58 = Curl_GetFTPResponse((Curl_easy *)conn_local,(ssize_t *)&cmd,&local_5c);
      }
      if (local_58 != CURLE_OK) {
        return local_58;
      }
      if (((ftpcode._3_1_ & 1) == 0) && (399 < local_5c)) {
        Curl_failf((Curl_easy *)conn_local,"QUOT string not accepted: %s",_result);
        return CURLE_QUOTE_ERROR;
      }
    }
    ftpc = (ftp_conn *)(ftpc->pp).cache_size;
  } while( true );
}

Assistant:

static
CURLcode ftp_sendquote(struct Curl_easy *data,
                       struct connectdata *conn, struct curl_slist *quote)
{
  struct curl_slist *item;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;

  item = quote;
  while(item) {
    if(item->data) {
      ssize_t nread;
      char *cmd = item->data;
      bool acceptfail = FALSE;
      CURLcode result;
      int ftpcode = 0;

      /* if a command starts with an asterisk, which a legal FTP command never
         can, the command will be allowed to fail without it causing any
         aborts or cancels etc. It will cause libcurl to act as if the command
         is successful, whatever the server reponds. */

      if(cmd[0] == '*') {
        cmd++;
        acceptfail = TRUE;
      }

      result = Curl_pp_sendf(data, &ftpc->pp, "%s", cmd);
      if(!result) {
        pp->response = Curl_now(); /* timeout relative now */
        result = Curl_GetFTPResponse(data, &nread, &ftpcode);
      }
      if(result)
        return result;

      if(!acceptfail && (ftpcode >= 400)) {
        failf(data, "QUOT string not accepted: %s", cmd);
        return CURLE_QUOTE_ERROR;
      }
    }

    item = item->next;
  }

  return CURLE_OK;
}